

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int canwearobj(obj *otmp,long *mask,boolean noisy)

{
  short sVar1;
  boolean bVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *line;
  
  if (otmp->oclass == '\x03') {
    if (objects[otmp->otyp].oc_subtyp == '\x05') {
      pcVar5 = "cloak";
    }
    else if (objects[otmp->otyp].oc_subtyp == '\x06') {
      pcVar5 = "shirt";
    }
    else {
      pcVar5 = (char *)0x0;
      if (objects[otmp->otyp].oc_subtyp == '\0') {
        pcVar5 = "suit";
      }
    }
  }
  else {
    pcVar5 = (char *)0x0;
  }
  if (((pcVar5 != (char *)0x0) &&
      ((bVar2 = breakarm(youmonst.data), bVar2 != '\0' ||
       (bVar2 = sliparm(youmonst.data), bVar2 != '\0')))) &&
     (((pcVar5 != "cloak" || ((youmonst.data)->msize != '\x01')) &&
      (iVar3 = racial_exception(&youmonst,otmp), iVar3 < 1)))) {
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "The %s will not fit on your body.";
LAB_0018732b:
    pline(pcVar6,pcVar5);
    return 0;
  }
  if ((otmp->owornmask & 0x7f) != 0) {
    if (noisy == '\0') {
      return 0;
    }
    pcVar5 = "that";
    uVar4 = 0x21;
    goto LAB_00187151;
  }
  iVar3 = welded(uwep);
  if (((((iVar3 != 0) && ((byte)(uwep->oclass | 4U) == 6)) &&
       ((objects[uwep->otyp].field_0x11 & 1) != 0)) && (otmp->oclass == '\x03')) &&
     ((objects[otmp->otyp].oc_subtyp == '\0' || (objects[otmp->otyp].oc_subtyp == '\x06')))) {
    if (noisy == '\0') {
      return 0;
    }
    pcVar5 = "weapon";
    if (((uwep->oclass == 2) && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
       (pcVar5 = "weapon", (byte)objects[uwep->otyp].oc_subtyp < 0xb)) {
      pcVar5 = "sword";
    }
    pcVar6 = "You cannot do that while holding your %s.";
    goto LAB_0018732b;
  }
  if (otmp->oclass != '\x03') {
LAB_001877ae:
    if (noisy != '\0') {
      silly_thing("wear",otmp);
      return 0;
    }
    return 0;
  }
  if (objects[otmp->otyp].oc_subtyp == '\x02') {
    if (uarmh == (obj *)0x0) {
      if ((((u.umonnum == u.umonster) || (iVar3 = num_horns(youmonst.data), iVar3 < 1)) ||
          ((long)otmp->otyp == 0x3d)) || ((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x180) == 0)
         ) {
        *mask = 4;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      iVar3 = num_horns(youmonst.data);
      pcVar5 = "s";
      if (iVar3 == 1) {
        pcVar5 = "";
      }
      line = "The %s won\'t fit over your horn%s.";
      pcVar6 = "helmet";
LAB_001873fa:
      pline(line,pcVar6,pcVar5);
      return 0;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar5 = "helmet";
  }
  else {
    if (objects[otmp->otyp].oc_subtyp != '\x01') {
      if (objects[otmp->otyp].oc_subtyp == '\x04') {
        if (uarmf == (obj *)0x0) {
          if (u.umonnum != u.umonster) {
            if (((youmonst.data)->mflags1 & 0x80000) != 0) {
              if (noisy == '\0') {
                return 0;
              }
              pcVar5 = "You have no feet...";
              goto LAB_001874b4;
            }
            if ((u.umonnum != u.umonster) && ((youmonst.data)->mlet == '\x1d')) {
              if (noisy == '\0') {
                return 0;
              }
              pcVar6 = "You have too many hooves to wear %s.";
              pcVar5 = "boots";
              goto LAB_0018732b;
            }
          }
          if (u.utrap != 0) {
            if (u.utraptype == 4) {
              if (noisy == '\0') {
                return 0;
              }
              pcVar5 = body_part(5);
              pcVar6 = makeplural(pcVar5);
              pcVar5 = surface((int)u.ux,(int)u.uy);
              line = "Your %s are stuck in the %s!";
              goto LAB_001873fa;
            }
            if (u.utraptype == 0) {
              if (noisy == '\0') {
                return 0;
              }
              pcVar5 = body_part(5);
              pcVar6 = "Your %s is trapped!";
              goto LAB_0018732b;
            }
          }
          *mask = 0x20;
          return 1;
        }
        if (noisy == '\0') {
          return 0;
        }
        pcVar5 = "boots";
      }
      else {
        if (objects[otmp->otyp].oc_subtyp != '\x03') {
          if (objects[otmp->otyp].oc_subtyp == '\x06') {
            if ((uarm == (obj *)0x0 && uarmc == (obj *)0x0) && uarmu == (obj *)0x0) {
              *mask = 0x40;
              return 1;
            }
            if (uarmu == (obj *)0x0) {
              if (noisy == '\0') {
                return 0;
              }
              if (uarm == (obj *)0x0 || uarmc != (obj *)0x0) {
                pcVar5 = cloak_simple_name(uarmc);
              }
              else {
                pcVar5 = "armor";
              }
              pcVar6 = "You can\'t wear that over your %s.";
              goto LAB_0018732b;
            }
            if (noisy == '\0') {
              return 0;
            }
            pcVar5 = "shirt";
          }
          else {
            if (objects[otmp->otyp].oc_subtyp != '\x05') {
              if (objects[otmp->otyp].oc_subtyp != '\0') goto LAB_001877ae;
              if (uarmc == (obj *)0x0) {
                if (uarm == (obj *)0x0) {
                  *mask = 1;
                  return 1;
                }
                if (noisy == '\0') {
                  return 0;
                }
                pcVar5 = "some armor";
                uVar4 = 0x2e;
                goto LAB_00187151;
              }
              if (noisy == '\0') {
                return 0;
              }
              pcVar5 = cloak_simple_name(uarmc);
              pcVar6 = "You cannot wear armor over a %s.";
              goto LAB_0018732b;
            }
            if (uarmc == (obj *)0x0) {
              *mask = 2;
              return 1;
            }
            if (noisy == '\0') {
              return 0;
            }
            pcVar5 = cloak_simple_name(uarmc);
          }
          goto LAB_001872ea;
        }
        if (uarmg == (obj *)0x0) {
          iVar3 = welded(uwep);
          if (iVar3 == 0) {
            *mask = 0x10;
            return 1;
          }
          if (noisy == '\0') {
            return 0;
          }
          pcVar5 = "weapon";
          if (((uwep->oclass == '\x02') && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
             (pcVar5 = "weapon", (byte)objects[uwep->otyp].oc_subtyp < 0xb)) {
            pcVar5 = "sword";
          }
          pcVar6 = "You cannot wear gloves over your %s.";
          goto LAB_0018732b;
        }
        if (noisy == '\0') {
          return 0;
        }
        pcVar5 = "gloves";
      }
      uVar4 = 0x2e;
      goto LAB_00187151;
    }
    if (uarms == (obj *)0x0) {
      if ((uwep != (obj *)0x0) && ((byte)(uwep->oclass | 4U) == 6)) {
        sVar1 = uwep->otyp;
        if ((objects[sVar1].field_0x11 & 1) != 0) {
          if (noisy == '\0') {
            return 0;
          }
          if ((uwep->oclass == 2) && ((byte)(objects[sVar1].oc_subtyp - 5U) < 6)) {
            pcVar5 = "sword";
          }
          else {
            pcVar5 = "weapon";
            if (sVar1 == 0x1c) {
              pcVar5 = "axe";
            }
          }
          pcVar6 = "You cannot wear a shield while wielding a two-handed %s.";
          goto LAB_0018732b;
        }
      }
      if (u.twoweap == '\0') {
        *mask = 8;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      pcVar5 = "You cannot wear a shield while wielding two weapons.";
LAB_001874b4:
      pline(pcVar5);
      return 0;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar5 = "shield";
  }
LAB_001872ea:
  pcVar5 = an(pcVar5);
  uVar4 = 0x2e;
  if (pcVar5 == "that") {
    uVar4 = 0x21;
  }
LAB_00187151:
  pline("You are already wearing %s%c",pcVar5,uVar4);
  return 0;
}

Assistant:

int canwearobj(struct obj *otmp, long *mask, boolean noisy)
{
    int err = 0;
    const char *which;

    which = is_cloak(otmp) ? c_cloak :
	    is_shirt(otmp) ? c_shirt :
	    is_suit(otmp) ? c_suit : 0;
    if (which && cantweararm(youmonst.data) &&
	    /* same exception for cloaks as used in m_dowear() */
	    (which != c_cloak || youmonst.data->msize != MZ_SMALL) &&
	    (racial_exception(&youmonst, otmp) < 1)) {
	if (noisy) pline("The %s will not fit on your body.", which);
	return 0;
    } else if (otmp->owornmask & W_ARMOR) {
	if (noisy) already_wearing(c_that_);
	return 0;
    }

    if (welded(uwep) && bimanual(uwep) && (is_suit(otmp) || is_shirt(otmp))) {
	if (noisy)
	    pline("You cannot do that while holding your %s.",
		is_sword(uwep) ? c_sword : c_weapon);
	return 0;
    }

    if (is_helmet(otmp)) {
	if (uarmh) {
	    if (noisy) already_wearing(an(c_helmet));
	    err++;
	} else if (Upolyd && has_horns(youmonst.data) && !is_flimsy(otmp)) {
	    /* (flimsy exception matches polyself handling) */
	    if (noisy)
		pline("The %s won't fit over your horn%s.",
			  c_helmet, plur(num_horns(youmonst.data)));
	    err++;
	} else
	    *mask = W_ARMH;
    } else if (is_shield(otmp)) {
	if (uarms) {
	    if (noisy) already_wearing(an(c_shield));
	    err++;
	} else if (uwep && bimanual(uwep)) {
	    if (noisy) 
		pline("You cannot wear a shield while wielding a two-handed %s.",
		    is_sword(uwep) ? c_sword :
		    (uwep->otyp == BATTLE_AXE) ? c_axe : c_weapon);
	    err++;
	} else if (u.twoweap) {
	    if (noisy)
		pline("You cannot wear a shield while wielding two weapons.");
	    err++;
	} else
	    *mask = W_ARMS;
    } else if (is_boots(otmp)) {
	if (uarmf) {
	    if (noisy) already_wearing(c_boots);
	    err++;
	} else if (Upolyd && slithy(youmonst.data)) {
	    if (noisy) pline("You have no feet...");	/* not body_part(FOOT) */
	    err++;
	} else if (Upolyd && youmonst.data->mlet == S_CENTAUR) {
	    /* break_armor() pushes boots off for centaurs,
	       so don't let dowear() put them back on... */
	    if (noisy) pline("You have too many hooves to wear %s.",
			     c_boots);	/* makeplural(body_part(FOOT)) yields
					   "rear hooves" which sounds odd */
	    err++;
	} else if (u.utrap && (u.utraptype == TT_BEARTRAP ||
				u.utraptype == TT_INFLOOR)) {
	    if (u.utraptype == TT_BEARTRAP) {
		if (noisy) pline("Your %s is trapped!", body_part(FOOT));
	    } else {
		if (noisy) pline("Your %s are stuck in the %s!",
				makeplural(body_part(FOOT)),
				surface(u.ux, u.uy));
	    }
	    err++;
	} else
	    *mask = W_ARMF;
    } else if (is_gloves(otmp)) {
	if (uarmg) {
	    if (noisy) already_wearing(c_gloves);
	    err++;
	} else if (welded(uwep)) {
	    if (noisy) pline("You cannot wear gloves over your %s.",
			   is_sword(uwep) ? c_sword : c_weapon);
	    err++;
	} else
	    *mask = W_ARMG;
    } else if (is_shirt(otmp)) {
	if (uarm || uarmc || uarmu) {
	    if (uarmu) {
		if (noisy) already_wearing(an(c_shirt));
	    } else {
		if (noisy) pline("You can't wear that over your %s.",
			           (uarm && !uarmc) ? c_armor : cloak_simple_name(uarmc));
	    }
	    err++;
	} else
	    *mask = W_ARMU;
    } else if (is_cloak(otmp)) {
	if (uarmc) {
	    if (noisy) already_wearing(an(cloak_simple_name(uarmc)));
	    err++;
	} else
	    *mask = W_ARMC;
    } else if (is_suit(otmp)) {
	if (uarmc) {
	    if (noisy) pline("You cannot wear armor over a %s.", cloak_simple_name(uarmc));
	    err++;
	} else if (uarm) {
	    if (noisy) already_wearing("some armor");
	    err++;
	} else
	    *mask = W_ARM;
    } else {
	/* getobj can't do this after setting its allow_all flag; that
	   happens if you have armor for slots that are covered up or
	   extra armor for slots that are filled */
	if (noisy) silly_thing("wear", otmp);
	err++;
    }
    return !err;
}